

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCnf.c
# Opt level: O2

void Sfm_PrintCnf(Vec_Str_t *vCnf)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  int i;
  
  for (i = 0; i < vCnf->nSize; i = i + 1) {
    cVar1 = Vec_StrEntry(vCnf,i);
    if (cVar1 == -1) {
      putchar(10);
    }
    else {
      iVar2 = Abc_LitIsCompl((int)cVar1);
      pcVar4 = "-";
      if (iVar2 == 0) {
        pcVar4 = "";
      }
      uVar3 = Abc_Lit2Var((int)cVar1);
      printf("%s%d ",pcVar4,(ulong)uVar3);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Sfm_PrintCnf( Vec_Str_t * vCnf )
{
    signed char Entry;
    int i, Lit;
    Vec_StrForEachEntry( vCnf, Entry, i )
    {
        Lit = (int)Entry;
        if ( Lit == -1 )
            printf( "\n" );
        else
            printf( "%s%d ", Abc_LitIsCompl(Lit) ? "-":"", Abc_Lit2Var(Lit) );
    }
}